

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptDate.cpp
# Opt level: O1

Var Js::JavascriptDate::EntrySetMinutes(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  double value;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  Var pvVar5;
  JavascriptDate *pJVar6;
  ScriptContext *pSVar7;
  int in_stack_00000010;
  Type TStack_40;
  Var result;
  undefined1 auStack_30 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar7 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar7->threadContext,0xc00,pSVar7,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x3bb,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) goto LAB_00bc7742;
    *puVar4 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  pSVar7 = (ScriptContext *)&args.super_Arguments.Values;
  auStack_30 = (undefined1  [8])args.super_Arguments.Values;
  ArgumentReader::AdjustArguments((ArgumentReader *)auStack_30,(CallInfo *)pSVar7);
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    pSVar7 = (ScriptContext *)0x3be;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x3be,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
LAB_00bc7742:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (((ulong)auStack_30 & 0xffffff) != 0) {
    pSVar7 = (ScriptContext *)0x0;
    pvVar5 = Arguments::operator[]((Arguments *)auStack_30,0);
    bVar2 = VarIs<Js::JavascriptDate>(pvVar5);
    if (bVar2) {
      pvVar5 = Arguments::operator[]((Arguments *)auStack_30,0);
      pJVar6 = VarTo<Js::JavascriptDate>(pvVar5);
      TStack_40 = (Type)auStack_30;
      result = (Var)args.super_Arguments.Info;
      value = DateImplementation::SetDateData
                        (&pJVar6->m_date,(Arguments *)&stack0xffffffffffffffc0,(DateData)0x5,false,
                         scriptContext);
      pvVar5 = JavascriptNumber::ToVarNoCheck(value,scriptContext);
      return pvVar5;
    }
  }
  TStack_40 = (Type)0x0;
  BVar3 = TryInvokeRemotely(EntrySetMinutes,pSVar7,(Arguments *)auStack_30,
                            (Var *)&stack0xffffffffffffffc0);
  if (BVar3 != 0) {
    return (Var)TStack_40;
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec3d,L"Date.prototype.setMinutes");
}

Assistant:

Var JavascriptDate::EntrySetMinutes(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0 || !VarIs<JavascriptDate>(args[0]))
        {
            Var result = nullptr;
            if (TryInvokeRemotely(EntrySetMinutes, scriptContext, args, &result))
            {
                return result;
            }
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedDate, _u("Date.prototype.setMinutes"));
        }
        JavascriptDate* date = VarTo<JavascriptDate>(args[0]);

        return JavascriptDate::SetDateData(date, args, DateImplementation::DateData::Minutes, scriptContext);
    }